

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O2

string_view __thiscall
google::protobuf::compiler::rust::MultiCasePrefixStripper::StripPrefix
          (MultiCasePrefixStripper *this,string_view name)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  string_view sVar7;
  string_view expected;
  size_t local_38;
  char *local_30;
  
  pcVar4 = name._M_str;
  sVar5 = name._M_len;
  lVar6 = 8;
  do {
    local_38 = sVar5;
    local_30 = pcVar4;
    if (lVar6 == 0x68) goto LAB_002a8694;
    pcVar3 = *(char **)((long)(this->prefixes_)._M_elems + lVar6 + -8);
    lVar1 = *(long *)((long)&(this->prefixes_)._M_elems[0]._M_dataplus._M_p + lVar6);
    cVar2 = absl::lts_20240722::StartsWithIgnoreCase(sVar5,pcVar4,lVar1);
    lVar6 = lVar6 + 0x20;
  } while (cVar2 == '\0');
  local_30 = pcVar4 + lVar1;
  local_38 = sVar5 - lVar1;
  expected._M_str = pcVar3;
  expected._M_len = (size_t)"_";
  absl::lts_20240722::ConsumePrefix
            ((lts_20240722 *)&local_38,(Nonnull<absl::string_view_*>)0x1,expected);
LAB_002a8694:
  if (local_38 == 0) {
    local_30 = pcVar4;
    local_38 = sVar5;
  }
  sVar7._M_str = local_30;
  sVar7._M_len = local_38;
  return sVar7;
}

Assistant:

absl::string_view MultiCasePrefixStripper::StripPrefix(
    absl::string_view name) const {
  absl::string_view start_name = name;
  for (absl::string_view prefix : prefixes_) {
    if (absl::StartsWithIgnoreCase(name, prefix)) {
      name.remove_prefix(prefix.size());

      // Also strip a joining underscore, if present.
      absl::ConsumePrefix(&name, "_");

      // Only strip one prefix.
      break;
    }
  }

  if (name.empty()) {
    return start_name;
  }
  return name;
}